

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_usleep(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int nSleep;
  jx9_vfs *pVfs;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((0 < nArg) && (iVar1 = jx9_value_is_int(*apArg), iVar1 != 0)) {
    pvVar2 = jx9_context_user_data(pCtx);
    if ((pvVar2 == (void *)0x0) || (*(long *)((long)pvVar2 + 0x50) == 0)) {
      pcVar3 = jx9_function_name(pCtx);
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",pcVar3);
    }
    else {
      iVar1 = jx9_value_to_int(*apArg);
      if (-1 < iVar1) {
        (**(code **)((long)pvVar2 + 0x50))(iVar1);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Vfs_usleep(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	int nSleep;
	if( nArg < 1 || !jx9_value_is_int(apArg[0]) ){
		/* Missing/Invalid argument, return immediately */
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xSleep == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		return JX9_OK;
	}
	/* Amount to sleep */
	nSleep = jx9_value_to_int(apArg[0]);
	if( nSleep < 0 ){
		/* Invalid value, return immediately */
		return JX9_OK;
	}
	/* Perform the requested operation (Microseconds) */
	pVfs->xSleep((unsigned int)nSleep);
	return JX9_OK;
}